

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapMapInfo(SnapObject *snpObject,FileWriter *writer)

{
  uint *puVar1;
  uint uVar2;
  
  if (snpObject->SnapObjectTag != SnapMapObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint *)snpObject->AddtlSnapObjectInfo;
  FileWriter::WriteLengthValue(writer,*puVar1,CommaAndBigSpaceSeparator);
  if (*puVar1 != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (*puVar1 != 0) {
      uVar2 = 0;
      do {
        (*writer->_vptr_FileWriter[4])(writer,(ulong)(3 - (uVar2 == 0)));
        NSSnapValues::EmitTTDVar
                  (*(TTDVar *)(*(long *)(puVar1 + 2) + (ulong)uVar2 * 8),writer,NoSeparator);
        NSSnapValues::EmitTTDVar
                  (*(TTDVar *)(*(long *)(puVar1 + 2) + (ulong)(uVar2 + 1) * 8),writer,CommaSeparator
                  );
        (*writer->_vptr_FileWriter[5])(writer,0);
        uVar2 = uVar2 + 2;
      } while (uVar2 < *puVar1);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapMapInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapMapInfo* mapInfo = SnapObjectGetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject);

            writer->WriteLengthValue(mapInfo->MapSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(mapInfo->MapSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    writer->WriteSequenceStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i], writer, NSTokens::Separator::NoSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i + 1], writer, NSTokens::Separator::CommaSeparator);
                    writer->WriteSequenceEnd();
                }
                writer->WriteSequenceEnd();
            }
        }